

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlComment::Print(TiXmlComment *this,FILE *cfile,int depth)

{
  char *pcVar1;
  int local_20;
  int i;
  int depth_local;
  FILE *cfile_local;
  TiXmlComment *this_local;
  
  if (cfile != (FILE *)0x0) {
    for (local_20 = 0; local_20 < depth; local_20 = local_20 + 1) {
      fprintf((FILE *)cfile,"    ");
    }
    pcVar1 = TiXmlString::c_str(&(this->super_TiXmlNode).value);
    fprintf((FILE *)cfile,"<!--%s-->",pcVar1);
    return;
  }
  __assert_fail("cfile",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                ,0x457,"virtual void despot::util::tinyxml::TiXmlComment::Print(FILE *, int) const")
  ;
}

Assistant:

void TiXmlComment::Print(FILE* cfile, int depth) const {
	assert(cfile);
	for (int i = 0; i < depth; i++) {
		fprintf(cfile, "    ");
	}
	fprintf(cfile, "<!--%s-->", value.c_str());
}